

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

Variable __thiscall LiteScript::_Type_STRING::OAdd(_Type_STRING *this,Variable *obj1,Variable *obj2)

{
  String *pSVar1;
  bool bVar2;
  Object *pOVar3;
  Type *pTVar4;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *puVar5;
  Variable VVar6;
  Variable tmp;
  String local_58;
  Variable local_38;
  
  pOVar3 = Variable::operator->((Variable *)in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar2 = Type::operator!=(pTVar4,(Type *)obj1);
  if (bVar2) {
    Variable::Convert(&local_38,in_RCX);
    pOVar3 = Variable::operator->(&local_38);
    pTVar4 = Object::GetType(pOVar3);
    bVar2 = Type::operator!=(pTVar4,(Type *)obj1);
    if (bVar2) {
      pOVar3 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    }
    else {
      pOVar3 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
      pOVar3 = Variable::operator->(obj2);
      pSVar1 = (String *)pOVar3->data;
      pOVar3 = Variable::operator->(&local_38);
      String::operator+(&local_58,pSVar1,(String *)pOVar3->data);
      pOVar3 = Variable::operator->((Variable *)this);
      String::operator=((String *)pOVar3->data,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_58.str._M_dataplus._M_p != &local_58.str.field_2) {
        operator_delete(local_58.str._M_dataplus._M_p);
      }
    }
    Variable::~Variable(&local_38);
    puVar5 = extraout_RDX_01;
  }
  else {
    pOVar3 = Variable::operator->(obj2);
    Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    pOVar3 = Variable::operator->(obj2);
    pSVar1 = (String *)pOVar3->data;
    pOVar3 = Variable::operator->((Variable *)in_RCX);
    String::operator+(&local_58,pSVar1,(String *)pOVar3->data);
    pOVar3 = Variable::operator->((Variable *)this);
    String::operator=((String *)pOVar3->data,&local_58);
    puVar5 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_58.str._M_dataplus._M_p != &local_58.str.field_2) {
      operator_delete(local_58.str._M_dataplus._M_p);
      puVar5 = extraout_RDX_00;
    }
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_STRING::OAdd(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != *this) {
        Variable tmp = obj2.Convert(*this);
        if (tmp->GetType() != *this)
            return obj1->memory.Create(Type::NIL);
        Variable res = obj1->memory.Create(Type::STRING);
        res->GetData<String>() = obj1->GetData<String>() + tmp->GetData<String>();
        return res;
    }
    Variable res = obj1->memory.Create(Type::STRING);
    res->GetData<String>() = obj1->GetData<String>() + obj2->GetData<String>();
    return res;
}